

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.cpp
# Opt level: O0

Expression * __thiscall
slang::ast::RangeSelectExpression::fromSyntax
          (RangeSelectExpression *this,Compilation *compilation,Expression *value,
          RangeSelectSyntax *syntax,SourceRange fullRange,ASTContext *context)

{
  Info **ppIVar1;
  int32_t r;
  int32_t iVar2;
  uint uVar3;
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  SourceRange sourceRange_02;
  SourceRange sourceRange_03;
  SourceRange sourceRange_04;
  Expression *pEVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  bitwidth_t bVar8;
  logic_error *this_00;
  Type *pTVar9;
  ExpressionSyntax *pEVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SourceLocation SVar11;
  bitmask<slang::ast::ASTFlags> *pbVar12;
  SourceLocation SVar13;
  ConstantValue *this_01;
  SVInt *this_02;
  ConstantRange *pCVar14;
  uint *puVar15;
  int *piVar16;
  Diagnostic *pDVar17;
  SourceRange range_00;
  optional<slang::ConstantRange> oVar18;
  int32_t local_588;
  bool local_532;
  byte local_529;
  byte local_519;
  bool local_501;
  FixedSizeUnpackedArrayType *local_4c8;
  size_t local_4c0;
  SourceLocation local_4b8;
  SourceLocation local_4b0;
  _Optional_payload_base<int> local_4a8;
  SourceLocation local_4a0;
  SourceLocation local_498;
  undefined4 local_48c;
  Diagnostic *local_488;
  Diagnostic *diag_3;
  _Optional_payload_base<int> local_478;
  optional<int> lv_1;
  ConstantRange selectionRange_1;
  size_t local_460;
  FixedSizeUnpackedArrayType *local_458;
  size_t local_450;
  SourceLocation local_448;
  SourceLocation SStack_440;
  undefined4 local_434;
  Diagnostic *local_430;
  Diagnostic *diag_2;
  SourceLocation SStack_420;
  undefined4 local_414;
  _Storage<slang::ConstantRange,_true> local_410;
  int32_t local_408;
  _Storage<slang::ConstantRange,_true> local_400;
  optional<slang::ConstantRange> range_1;
  int32_t l;
  int32_t local_3c0;
  _Storage<slang::ConstantRange,_true> local_3b8;
  optional<slang::ConstantRange> range;
  Diagnostic *diag_1;
  optional<int> index;
  undefined1 local_348 [8];
  ConstantValue leftVal;
  Diagnostic *diag;
  _Optional_payload_base<int> local_2d8;
  optional<int> lv;
  anon_class_40_5_26fa91f2 validateRange;
  ConstantRange valueRange;
  ConstantRange selectionRange;
  undefined1 auStack_288 [8];
  SourceRange errorRange;
  optional<int> rv;
  RandomizeDetails *local_260;
  byte local_251;
  ConstantValue local_250;
  byte local_221;
  ConstantValue local_220;
  bitmask<slang::ast::ASTFlags> local_1f8;
  uint local_1ec;
  QueueType *local_1e8;
  size_t local_1e0;
  Compilation *local_1d8;
  SourceLocation local_1d0;
  undefined4 local_1c4;
  bitmask<slang::ast::ASTFlags> local_1c0;
  Compilation *local_1b8;
  SourceLocation local_1b0;
  Info *local_1a8;
  ExpressionSyntax *local_1a0;
  SourceRange local_198;
  Type *local_188;
  Type *elementType;
  Type *valueType;
  RangeSelectExpression *result;
  Expression *local_168;
  Expression *right;
  Scope *local_158;
  Expression *left;
  byte local_141;
  bitmask<slang::ast::ASTFlags> bStack_140;
  bool isQueue;
  bitmask<slang::ast::ASTFlags> extraFlags;
  string local_120;
  allocator<char> local_e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  RangeSelectionKind local_44;
  SourceLocation SStack_40;
  RangeSelectionKind selectionKind;
  ASTContext *context_local;
  RangeSelectSyntax *syntax_local;
  Expression *value_local;
  Compilation *compilation_local;
  SourceRange fullRange_local;
  
  SStack_40 = fullRange.endLoc;
  fullRange_local.startLoc = fullRange.startLoc;
  iVar7 = *(int *)&(value->type).ptr;
  context_local = (ASTContext *)value;
  syntax_local = (RangeSelectSyntax *)compilation;
  value_local = &this->super_Expression;
  compilation_local = (Compilation *)syntax;
  if (iVar7 == 0x1b) {
    local_44 = IndexedUp;
  }
  else if (iVar7 == 0x88) {
    local_44 = IndexedDown;
  }
  else {
    if (iVar7 != 0x19b) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/SelectExpressions.cpp"
                 ,&local_e9);
      std::operator+(&local_c8,&local_e8,":");
      std::__cxx11::to_string(&local_120,0x1a2);
      std::operator+(&local_a8,&local_c8,&local_120);
      std::operator+(&local_88,&local_a8,": ");
      std::operator+(&local_68,&local_88,"Default case should be unreachable!");
      std::logic_error::logic_error(this_00,(string *)&local_68);
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    local_44 = Simple;
  }
  bVar5 = Expression::bad((Expression *)compilation);
  if (!bVar5) {
    pTVar9 = not_null<const_slang::ast::Type_*>::operator->
                       ((not_null<const_slang::ast::Type_*> *)
                        &(syntax_local->super_SelectorSyntax).super_SyntaxNode.kind);
    bVar5 = Type::isAssociativeArray(pTVar9);
    if (bVar5) {
      extraFlags.m_bits = (underlying_type)compilation_local;
      sourceRange_04.endLoc = fullRange_local.startLoc;
      sourceRange_04.startLoc = (SourceLocation)compilation_local;
      ASTContext::addDiag((ASTContext *)SStack_40,(DiagCode)0x7a0007,sourceRange_04);
      SVar11 = (SourceLocation)Expression::badExpr((Compilation *)value_local,(Expression *)0x0);
      return (Expression *)SVar11;
    }
  }
  bitmask<slang::ast::ASTFlags>::bitmask(&stack0xfffffffffffffec0);
  pTVar9 = not_null<const_slang::ast::Type_*>::operator->
                     ((not_null<const_slang::ast::Type_*> *)
                      &(syntax_local->super_SelectorSyntax).super_SyntaxNode.kind);
  local_141 = Type::isQueue(pTVar9);
  if ((bool)local_141) {
    left = (Expression *)ast::operator|(AllowUnboundedLiteral,AllowUnboundedLiteralArithmetic);
    bStack_140 = (bitmask<slang::ast::ASTFlags>)left;
  }
  pEVar10 = not_null<slang::syntax::ExpressionSyntax_*>::operator*
                      ((not_null<slang::syntax::ExpressionSyntax_*> *)&context_local->flags);
  right = (Expression *)bStack_140.m_bits;
  iVar7 = Expression::bind((int)pEVar10,(sockaddr *)SStack_40,(socklen_t)bStack_140.m_bits);
  local_158 = (Scope *)CONCAT44(extraout_var,iVar7);
  pEVar10 = not_null<slang::syntax::ExpressionSyntax_*>::operator*
                      ((not_null<slang::syntax::ExpressionSyntax_*> *)
                       &context_local->randomizeDetails);
  result = (RangeSelectExpression *)bStack_140.m_bits;
  iVar7 = Expression::bind((int)pEVar10,(sockaddr *)SStack_40,(socklen_t)bStack_140.m_bits);
  pEVar4 = value_local;
  local_168 = (Expression *)CONCAT44(extraout_var_00,iVar7);
  pTVar9 = Compilation::getErrorType((Compilation *)value_local);
  valueType = (Type *)BumpAllocator::
                      emplace<slang::ast::RangeSelectExpression,slang::ast::RangeSelectionKind&,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::Expression_const&,slang::ast::Expression_const&,slang::SourceRange&>
                                ((BumpAllocator *)pEVar4,&local_44,pTVar9,(Expression *)syntax_local
                                 ,(Expression *)local_158,local_168,
                                 (SourceRange *)&compilation_local);
  bVar5 = Expression::bad((Expression *)syntax_local);
  if (((bVar5) || (bVar5 = Expression::bad((Expression *)local_158), bVar5)) ||
     (bVar5 = Expression::bad(local_168), bVar5)) {
    SVar11 = (SourceLocation)Expression::badExpr((Compilation *)value_local,(Expression *)valueType)
    ;
    return (Expression *)SVar11;
  }
  pTVar9 = not_null<const_slang::ast::Type_*>::operator->
                     ((not_null<const_slang::ast::Type_*> *)&local_158->thisSym);
  bVar5 = Type::isUnbounded(pTVar9);
  if ((!bVar5) &&
     (bVar5 = ASTContext::requireIntegral((ASTContext *)SStack_40,(Expression *)local_158), !bVar5))
  {
    SVar11 = (SourceLocation)Expression::badExpr((Compilation *)value_local,(Expression *)valueType)
    ;
    return (Expression *)SVar11;
  }
  pTVar9 = not_null<const_slang::ast::Type_*>::operator->(&local_168->type);
  bVar5 = Type::isUnbounded(pTVar9);
  if ((!bVar5) && (bVar5 = ASTContext::requireIntegral((ASTContext *)SStack_40,local_168), !bVar5))
  {
    SVar11 = (SourceLocation)Expression::badExpr((Compilation *)value_local,(Expression *)valueType)
    ;
    return (Expression *)SVar11;
  }
  pTVar9 = not_null<const_slang::ast::Type_*>::operator*
                     ((not_null<const_slang::ast::Type_*> *)
                      &(syntax_local->super_SelectorSyntax).super_SyntaxNode.kind);
  pEVar4 = value_local;
  SVar11 = SStack_40;
  elementType = pTVar9;
  local_198 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)context_local);
  ppIVar1 = &(syntax_local->range).info;
  local_1a8 = *ppIVar1;
  local_1a0 = (syntax_local->right).ptr;
  SVar13 = local_198.endLoc;
  local_188 = getIndexedType((Compilation *)pEVar4,(ASTContext *)SVar11,pTVar9,local_198,
                             *(SourceRange *)ppIVar1,true);
  bVar5 = Type::isError(local_188);
  if (bVar5) {
    SVar11 = (SourceLocation)Expression::badExpr((Compilation *)value_local,(Expression *)valueType)
    ;
    return (Expression *)SVar11;
  }
  local_1b8 = compilation_local;
  local_1b0 = fullRange_local.startLoc;
  range_00.endLoc = SStack_40;
  range_00.startLoc = fullRange_local.startLoc;
  checkForVectoredSelect
            ((ast *)syntax_local,(Expression *)compilation_local,range_00,(ASTContext *)SVar13);
  bVar5 = Type::hasFixedRange(elementType);
  local_501 = false;
  if (!bVar5) {
    pbVar12 = (bitmask<slang::ast::ASTFlags> *)((long)SStack_40 + 0x10);
    bitmask<slang::ast::ASTFlags>::bitmask(&local_1c0,NonProcedural);
    local_501 = bitmask<slang::ast::ASTFlags>::has(pbVar12,&local_1c0);
  }
  if (local_501 != false) {
    local_1c4 = 0x420007;
    local_1d8 = compilation_local;
    local_1d0 = fullRange_local.startLoc;
    sourceRange_03.endLoc = fullRange_local.startLoc;
    sourceRange_03.startLoc = (SourceLocation)compilation_local;
    ASTContext::addDiag((ASTContext *)SStack_40,(DiagCode)0x420007,sourceRange_03);
    SVar11 = (SourceLocation)Expression::badExpr((Compilation *)value_local,(Expression *)valueType)
    ;
    return (Expression *)SVar11;
  }
  if ((local_141 & 1) != 0) {
    local_1ec = 0;
    local_1e8 = BumpAllocator::emplace<slang::ast::QueueType,slang::ast::Type_const&,unsigned_int>
                          ((BumpAllocator *)value_local,local_188,&local_1ec);
    not_null<slang::ast::Type_const*>::not_null<slang::ast::QueueType*,void>
              ((not_null<slang::ast::Type_const*> *)&local_1e0,&local_1e8);
    (valueType->super_Symbol).name._M_len = local_1e0;
    return (Expression *)(SourceLocation)valueType;
  }
  pbVar12 = (bitmask<slang::ast::ASTFlags> *)((long)SStack_40 + 0x10);
  bitmask<slang::ast::ASTFlags>::bitmask(&local_1f8,StreamingWithRange);
  bVar5 = bitmask<slang::ast::ASTFlags>::has(pbVar12,&local_1f8);
  if (bVar5) {
    bVar5 = ASTContext::inUnevaluatedBranch((ASTContext *)SStack_40);
    local_221 = 0;
    local_251 = 0;
    local_519 = 1;
    if (!bVar5) {
      ASTContext::tryEval(&local_220,(ASTContext *)SStack_40,local_168);
      local_221 = 1;
      bVar5 = slang::ConstantValue::operator_cast_to_bool(&local_220);
      local_519 = 1;
      if (bVar5) {
        local_529 = 0;
        if (local_44 == Simple) {
          ASTContext::tryEval(&local_250,(ASTContext *)SStack_40,(Expression *)local_158);
          local_251 = 1;
          bVar5 = slang::ConstantValue::operator_cast_to_bool(&local_250);
          local_529 = bVar5 ^ 0xff;
        }
        local_519 = local_529;
      }
    }
    if ((local_251 & 1) != 0) {
      slang::ConstantValue::~ConstantValue(&local_250);
    }
    if ((local_221 & 1) != 0) {
      slang::ConstantValue::~ConstantValue(&local_220);
    }
    if ((local_519 & 1) != 0) {
      rv.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
      _M_payload._M_value = 0;
      register0x00000000 =
           (TempVarSymbol *)
           BumpAllocator::emplace<slang::ast::QueueType,slang::ast::Type_const&,unsigned_int>
                     ((BumpAllocator *)value_local,local_188,(uint *)&rv);
      not_null<slang::ast::Type_const*>::not_null<slang::ast::QueueType*,void>
                ((not_null<slang::ast::Type_const*> *)&local_260,
                 (QueueType **)
                 &rv.super__Optional_base<int,_true,_true>._M_payload.
                  super__Optional_payload_base<int>._M_engaged);
      (valueType->super_Symbol).name._M_len = (size_t)local_260;
      return (Expression *)(SourceLocation)valueType;
    }
  }
  register0x00000000 =
       (_Optional_payload_base<int>)ASTContext::evalInteger((ASTContext *)SStack_40,local_168);
  bVar5 = std::optional::operator_cast_to_bool((optional *)&errorRange.endLoc.field_0x4);
  if (!bVar5) {
    SVar11 = (SourceLocation)Expression::badExpr((Compilation *)value_local,(Expression *)valueType)
    ;
    return (Expression *)SVar11;
  }
  SVar11 = SourceRange::start((SourceRange *)&local_158->lastMember);
  SVar13 = SourceRange::end(&local_168->sourceRange);
  SourceRange::SourceRange((SourceRange *)auStack_288,SVar11,SVar13);
  bVar5 = Type::hasFixedRange(elementType);
  if (!bVar5) {
    ConstantRange::ConstantRange((ConstantRange *)&lv_1);
    if (local_44 == Simple) {
      local_478 = (_Optional_payload_base<int>)
                  ASTContext::evalInteger((ASTContext *)SStack_40,(Expression *)local_158);
      bVar5 = std::optional::operator_cast_to_bool((optional *)&local_478);
      if (!bVar5) {
        SVar11 = (SourceLocation)
                 Expression::badExpr((Compilation *)value_local,(Expression *)valueType);
        return (Expression *)SVar11;
      }
      piVar16 = std::optional<int>::operator*((optional<int> *)&local_478);
      diag_3._0_4_ = *piVar16;
      piVar16 = std::optional<int>::operator*((optional<int> *)&errorRange.endLoc.field_0x4);
      diag_3._4_4_ = *piVar16;
      lv_1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>._4_4_
           = diag_3._4_4_;
      lv_1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
      _M_payload._M_value = diag_3._0_4_;
      bVar5 = ConstantRange::isLittleEndian((ConstantRange *)&lv_1);
      if ((bVar5) && (bVar8 = ConstantRange::width((ConstantRange *)&lv_1), 1 < bVar8)) {
        local_48c = 0x830007;
        local_4a0 = (SourceLocation)auStack_288;
        local_498 = errorRange.startLoc;
        sourceRange.endLoc = errorRange.startLoc;
        sourceRange.startLoc = (SourceLocation)auStack_288;
        local_488 = ASTContext::addDiag((ASTContext *)SStack_40,(DiagCode)0x830007,sourceRange);
        pDVar17 = Diagnostic::operator<<
                            (local_488,
                             lv_1.super__Optional_base<int,_true,_true>._M_payload.
                             super__Optional_payload_base<int>._M_payload._M_value);
        Diagnostic::operator<<
                  (pDVar17,lv_1.super__Optional_base<int,_true,_true>._M_payload.
                           super__Optional_payload_base<int>._4_4_);
        ast::operator<<(local_488,elementType);
        SVar11 = (SourceLocation)
                 Expression::badExpr((Compilation *)value_local,(Expression *)valueType);
        return (Expression *)SVar11;
      }
    }
    else {
      local_4a8 = stack0xfffffffffffffd8c;
      local_4b8 = (local_168->sourceRange).startLoc;
      local_4b0 = (local_168->sourceRange).endLoc;
      bVar5 = ASTContext::requireGtZero
                        ((ASTContext *)SStack_40,(optional<int>)stack0xfffffffffffffd8c,
                         local_168->sourceRange);
      if (!bVar5) {
        SVar11 = (SourceLocation)
                 Expression::badExpr((Compilation *)value_local,(Expression *)valueType);
        return (Expression *)SVar11;
      }
      lv_1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int> =
           (_Optional_base<int,_true,_true>)
           ((ulong)(uint)lv_1.super__Optional_base<int,_true,_true>._M_payload.
                         super__Optional_payload_base<int>._4_4_ << 0x20);
      piVar16 = std::optional<int>::operator*((optional<int> *)&errorRange.endLoc.field_0x4);
      lv_1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>._4_4_
           = *piVar16 + -1;
    }
    local_4c8 = BumpAllocator::
                emplace<slang::ast::FixedSizeUnpackedArrayType,slang::ast::Type_const&,slang::ConstantRange&>
                          ((BumpAllocator *)value_local,local_188,(ConstantRange *)&lv_1);
    not_null<slang::ast::Type_const*>::not_null<slang::ast::FixedSizeUnpackedArrayType*,void>
              ((not_null<slang::ast::Type_const*> *)&local_4c0,&local_4c8);
    (valueType->super_Symbol).name._M_len = local_4c0;
    return (Expression *)valueType;
  }
  ConstantRange::ConstantRange(&valueRange);
  validateRange.result = (RangeSelectExpression **)Type::getFixedRange(elementType);
  lv.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int> =
       (_Optional_base<int,_true,_true>)&validateRange.result;
  validateRange.valueRange = (ConstantRange *)SStack_40;
  validateRange.context = (ASTContext *)auStack_288;
  validateRange.errorRange = (SourceRange *)elementType;
  validateRange.valueType = (Type *)&valueType;
  if (local_44 == Simple) {
    local_2d8 = (_Optional_payload_base<int>)
                ASTContext::evalInteger((ASTContext *)SStack_40,(Expression *)local_158);
    bVar5 = std::optional::operator_cast_to_bool((optional *)&local_2d8);
    if (!bVar5) {
      SVar11 = (SourceLocation)
               Expression::badExpr((Compilation *)value_local,(Expression *)valueType);
      return (Expression *)SVar11;
    }
    piVar16 = std::optional<int>::operator*((optional<int> *)&local_2d8);
    iVar7 = *piVar16;
    piVar16 = std::optional<int>::operator*((optional<int> *)&errorRange.endLoc.field_0x4);
    valueRange.right = *piVar16;
    valueRange.left = iVar7;
    bVar5 = ConstantRange::isLittleEndian(&valueRange);
    bVar6 = ConstantRange::isLittleEndian((ConstantRange *)&validateRange.result);
    if ((bVar5 != bVar6) && (bVar8 = ConstantRange::width(&valueRange), 1 < bVar8)) {
      sourceRange_02.endLoc = errorRange.startLoc;
      sourceRange_02.startLoc = (SourceLocation)auStack_288;
      pDVar17 = ASTContext::addDiag((ASTContext *)SStack_40,(DiagCode)0x840007,sourceRange_02);
      ast::operator<<(pDVar17,elementType);
      SVar11 = (SourceLocation)
               Expression::badExpr((Compilation *)value_local,(Expression *)valueType);
      return (Expression *)SVar11;
    }
    bVar5 = ASTContext::inUnevaluatedBranch((ASTContext *)SStack_40);
    if (!bVar5) {
      fromSyntax::anon_class_40_5_26fa91f2::operator()((anon_class_40_5_26fa91f2 *)&lv,valueRange);
    }
    goto LAB_0069f2eb;
  }
  leftVal.value.
  super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  .
  super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  .
  super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  .
  super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  .
  super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  .
  super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  ._32_8_ = (local_168->sourceRange).startLoc;
  bVar5 = ASTContext::requireGtZero
                    ((ASTContext *)SStack_40,(optional<int>)stack0xfffffffffffffd8c,
                     local_168->sourceRange);
  if (!bVar5) {
    SVar11 = (SourceLocation)Expression::badExpr((Compilation *)value_local,(Expression *)valueType)
    ;
    return (Expression *)SVar11;
  }
  slang::ConstantValue::ConstantValue((ConstantValue *)local_348);
  index.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
  _M_payload._M_value._3_1_ = 0;
  bVar5 = ASTContext::inUnevaluatedBranch((ASTContext *)SStack_40);
  local_532 = false;
  if (!bVar5) {
    ASTContext::tryEval((ConstantValue *)
                        &index.super__Optional_base<int,_true,_true>._M_payload.
                         super__Optional_payload_base<int>._M_engaged,(ASTContext *)SStack_40,
                        (Expression *)local_158);
    index.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
    _M_payload._M_value._3_1_ = 1;
    this_01 = slang::ConstantValue::operator=
                        ((ConstantValue *)local_348,
                         (ConstantValue *)
                         &index.super__Optional_base<int,_true,_true>._M_payload.
                          super__Optional_payload_base<int>._M_engaged);
    local_532 = slang::ConstantValue::operator_cast_to_bool(this_01);
  }
  if ((index.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
       _M_payload._M_value._3_1_ & 1) != 0) {
    slang::ConstantValue::~ConstantValue
              ((ConstantValue *)
               &index.super__Optional_base<int,_true,_true>._M_payload.
                super__Optional_payload_base<int>._M_engaged);
  }
  if (local_532 == false) {
    if (local_44 == IndexedUp) {
      local_588 = ConstantRange::lower((ConstantRange *)&validateRange.result);
    }
    else {
      local_588 = ConstantRange::upper((ConstantRange *)&validateRange.result);
    }
    range_1.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
    super__Optional_payload_base<slang::ConstantRange>._M_payload._M_value.right = local_588;
    piVar16 = std::optional<int>::operator*((optional<int> *)&errorRange.endLoc.field_0x4);
    iVar2 = *piVar16;
    bVar5 = ConstantRange::isLittleEndian((ConstantRange *)&validateRange.result);
    oVar18 = ConstantRange::getIndexedRange(local_588,iVar2,bVar5,local_44 == IndexedUp);
    local_410 = oVar18.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                super__Optional_payload_base<slang::ConstantRange>._M_payload;
    local_408 = CONCAT31(local_408._1_3_,
                         oVar18.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                         super__Optional_payload_base<slang::ConstantRange>._M_engaged);
    range_1.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
    super__Optional_payload_base<slang::ConstantRange>._M_payload._M_value.left = local_408;
    local_400 = local_410;
    bVar5 = std::optional::operator_cast_to_bool((optional *)&local_400._M_value);
    if (bVar5) {
      pCVar14 = std::optional<slang::ConstantRange>::operator*
                          ((optional<slang::ConstantRange> *)&local_400._M_value);
      valueRange = *pCVar14;
      puVar15 = (uint *)std::optional<int>::operator*((optional<int> *)&errorRange.endLoc.field_0x4)
      ;
      uVar3 = *puVar15;
      bVar8 = ConstantRange::width((ConstantRange *)&validateRange.result);
      if (bVar8 < uVar3) {
        local_434 = 0x9f0007;
        local_448 = (local_168->sourceRange).startLoc;
        SStack_440 = (local_168->sourceRange).endLoc;
        pDVar17 = ASTContext::addDiag((ASTContext *)SStack_40,(DiagCode)0x9f0007,
                                      local_168->sourceRange);
        local_430 = pDVar17;
        piVar16 = std::optional<int>::operator*((optional<int> *)&errorRange.endLoc.field_0x4);
        Diagnostic::operator<<(pDVar17,*piVar16);
        ast::operator<<(local_430,elementType);
      }
LAB_0069f2b1:
      range.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::ConstantRange>._M_payload._M_value.right = 0;
    }
    else {
      local_414 = 0x7b0007;
      diag_2 = (Diagnostic *)auStack_288;
      SStack_420 = errorRange.startLoc;
      sourceRange_00.endLoc = errorRange.startLoc;
      sourceRange_00.startLoc = (SourceLocation)auStack_288;
      ASTContext::addDiag((ASTContext *)SStack_40,(DiagCode)0x7b0007,sourceRange_00);
      fullRange_local.endLoc =
           (SourceLocation)Expression::badExpr((Compilation *)value_local,(Expression *)valueType);
      range.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::ConstantRange>._M_payload._M_value.right = 1;
    }
  }
  else {
    this_02 = slang::ConstantValue::integer((ConstantValue *)local_348);
    register0x00000000 = (_Optional_payload_base<int>)SVInt::as<int,void>(this_02);
    bVar5 = std::optional::operator_cast_to_bool((optional *)((long)&diag_1 + 4));
    if (bVar5) {
      piVar16 = std::optional<int>::operator*((optional<int> *)((long)&diag_1 + 4));
      iVar2 = *piVar16;
      piVar16 = std::optional<int>::operator*((optional<int> *)&errorRange.endLoc.field_0x4);
      r = *piVar16;
      bVar5 = ConstantRange::isLittleEndian((ConstantRange *)&validateRange.result);
      oVar18 = ConstantRange::getIndexedRange(iVar2,r,bVar5,local_44 == IndexedUp);
      local_3b8 = oVar18.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                  super__Optional_payload_base<slang::ConstantRange>._M_payload;
      local_3c0 = CONCAT31(local_3c0._1_3_,
                           oVar18.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                           super__Optional_payload_base<slang::ConstantRange>._M_engaged);
      range.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::ConstantRange>._M_payload._M_value.left = local_3c0;
      bVar5 = std::optional::operator_cast_to_bool((optional *)&local_3b8._M_value);
      if (bVar5) {
        pCVar14 = std::optional<slang::ConstantRange>::operator*
                            ((optional<slang::ConstantRange> *)&local_3b8._M_value);
        unique0x00012000 = *pCVar14;
        valueRange = unique0x00012000;
        fromSyntax::anon_class_40_5_26fa91f2::operator()
                  ((anon_class_40_5_26fa91f2 *)&lv,unique0x00012000);
        goto LAB_0069f2b1;
      }
      sourceRange_01.endLoc = errorRange.startLoc;
      sourceRange_01.startLoc = (SourceLocation)auStack_288;
      ASTContext::addDiag((ASTContext *)SStack_40,(DiagCode)0x7b0007,sourceRange_01);
      fullRange_local.endLoc =
           (SourceLocation)Expression::badExpr((Compilation *)value_local,(Expression *)valueType);
      range.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::ConstantRange>._M_payload._M_value.right = 1;
    }
    else {
      unique0x10000b68 = ((SourceRange *)&local_158->lastMember)->startLoc;
      pDVar17 = ASTContext::addDiag((ASTContext *)SStack_40,(DiagCode)0x510007,
                                    *(SourceRange *)&local_158->lastMember);
      Diagnostic::operator<<(pDVar17,(ConstantValue *)local_348);
      ast::operator<<(pDVar17,elementType);
      fullRange_local.endLoc =
           (SourceLocation)Expression::badExpr((Compilation *)value_local,(Expression *)valueType);
      range.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::ConstantRange>._M_payload._M_value.right = 1;
    }
  }
  slang::ConstantValue::~ConstantValue((ConstantValue *)local_348);
  if (range.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::ConstantRange>._M_payload._M_value.right != 0) {
    return (Expression *)fullRange_local.endLoc;
  }
LAB_0069f2eb:
  bVar5 = Type::isUnpackedArray(elementType);
  if (bVar5) {
    local_458 = BumpAllocator::
                emplace<slang::ast::FixedSizeUnpackedArrayType,slang::ast::Type_const&,slang::ConstantRange&>
                          ((BumpAllocator *)value_local,local_188,&valueRange);
    not_null<slang::ast::Type_const*>::not_null<slang::ast::FixedSizeUnpackedArrayType*,void>
              ((not_null<slang::ast::Type_const*> *)&local_450,&local_458);
    (valueType->super_Symbol).name._M_len = local_450;
  }
  else {
    selectionRange_1 =
         (ConstantRange)
         BumpAllocator::
         emplace<slang::ast::PackedArrayType,slang::ast::Type_const&,slang::ConstantRange&>
                   ((BumpAllocator *)value_local,local_188,&valueRange);
    not_null<slang::ast::Type_const*>::not_null<slang::ast::PackedArrayType*,void>
              ((not_null<slang::ast::Type_const*> *)&local_460,(PackedArrayType **)&selectionRange_1
              );
    (valueType->super_Symbol).name._M_len = local_460;
  }
  return (Expression *)(SourceLocation)valueType;
}

Assistant:

Expression& RangeSelectExpression::fromSyntax(Compilation& compilation, Expression& value,
                                              const RangeSelectSyntax& syntax,
                                              SourceRange fullRange, const ASTContext& context) {
    // Left and right are either the extents of a part-select, in which case they must
    // both be constant, or the left hand side is the start and the right hand side is
    // the width of an indexed part select, in which case only the rhs need be constant.
    RangeSelectionKind selectionKind;
    switch (syntax.kind) {
        case SyntaxKind::SimpleRangeSelect:
            selectionKind = RangeSelectionKind::Simple;
            break;
        case SyntaxKind::AscendingRangeSelect:
            selectionKind = RangeSelectionKind::IndexedUp;
            break;
        case SyntaxKind::DescendingRangeSelect:
            selectionKind = RangeSelectionKind::IndexedDown;
            break;
        default:
            ASSUME_UNREACHABLE;
    }

    if (!value.bad() && value.type->isAssociativeArray()) {
        context.addDiag(diag::RangeSelectAssociative, fullRange);
        return badExpr(compilation, nullptr);
    }

    // Selection expressions don't need to be const if we're selecting from a queue.
    bitmask<ASTFlags> extraFlags;
    bool isQueue = value.type->isQueue();
    if (isQueue)
        extraFlags = ASTFlags::AllowUnboundedLiteral | ASTFlags::AllowUnboundedLiteralArithmetic;

    auto& left = bind(*syntax.left, context, extraFlags);
    auto& right = bind(*syntax.right, context, extraFlags);

    auto result = compilation.emplace<RangeSelectExpression>(selectionKind,
                                                             compilation.getErrorType(), value,
                                                             left, right, fullRange);

    if (value.bad() || left.bad() || right.bad())
        return badExpr(compilation, result);

    if (!left.type->isUnbounded() && !context.requireIntegral(left))
        return badExpr(compilation, result);

    if (!right.type->isUnbounded() && !context.requireIntegral(right))
        return badExpr(compilation, result);

    const Type& valueType = *value.type;
    const Type& elementType = getIndexedType(compilation, context, valueType, syntax.sourceRange(),
                                             value.sourceRange, true);
    if (elementType.isError())
        return badExpr(compilation, result);

    // Selects of vectored nets are disallowed.
    checkForVectoredSelect(value, fullRange, context);

    if (!valueType.hasFixedRange() && context.flags.has(ASTFlags::NonProcedural)) {
        context.addDiag(diag::DynamicNotProcedural, fullRange);
        return badExpr(compilation, result);
    }

    // If this is selecting from a queue, the result is always a queue.
    if (isQueue) {
        result->type = compilation.emplace<QueueType>(elementType, 0u);
        return *result;
    }

    // If this is a streaming concatenation's "with" range, we also don't
    // require a constant width, but we'll try to validate it if we see
    // that the bounds are constant anyway.
    if (context.flags.has(ASTFlags::StreamingWithRange)) {
        if (context.inUnevaluatedBranch() || !context.tryEval(right) ||
            (selectionKind == RangeSelectionKind::Simple && !context.tryEval(left))) {
            result->type = compilation.emplace<QueueType>(elementType, 0u);
            return *result;
        }
    }

    std::optional<int32_t> rv = context.evalInteger(right);
    if (!rv)
        return badExpr(compilation, result);

    // If the array type has a fixed range, validate that the range we're selecting is allowed.
    SourceRange errorRange{left.sourceRange.start(), right.sourceRange.end()};
    if (valueType.hasFixedRange()) {
        ConstantRange selectionRange;
        ConstantRange valueRange = valueType.getFixedRange();

        // Helper function for validating the bounds of the selection.
        auto validateRange = [&](ConstantRange range) {
            if (!valueRange.containsPoint(range.left) || !valueRange.containsPoint(range.right)) {
                auto& diag = context.addDiag(diag::RangeOOB, errorRange);
                diag << range.left << range.right;
                diag << valueType;

                result->warnedAboutRange = true;
            }
        };

        if (selectionKind == RangeSelectionKind::Simple) {
            std::optional<int32_t> lv = context.evalInteger(left);
            if (!lv)
                return badExpr(compilation, result);

            selectionRange = {*lv, *rv};
            if (selectionRange.isLittleEndian() != valueRange.isLittleEndian() &&
                selectionRange.width() > 1) {
                auto& diag = context.addDiag(diag::SelectEndianMismatch, errorRange);
                diag << valueType;
                return badExpr(compilation, result);
            }

            if (!context.inUnevaluatedBranch())
                validateRange(selectionRange);
        }
        else {
            if (!context.requireGtZero(rv, right.sourceRange))
                return badExpr(compilation, result);

            // If the lhs is a known constant, we can check that now too.
            ConstantValue leftVal;
            if (!context.inUnevaluatedBranch() && (leftVal = context.tryEval(left))) {
                std::optional<int32_t> index = leftVal.integer().as<int32_t>();
                if (!index) {
                    auto& diag = context.addDiag(diag::IndexValueInvalid, left.sourceRange);
                    diag << leftVal;
                    diag << valueType;
                    return badExpr(compilation, result);
                }

                auto range =
                    ConstantRange::getIndexedRange(*index, *rv, valueRange.isLittleEndian(),
                                                   selectionKind == RangeSelectionKind::IndexedUp);
                if (!range) {
                    context.addDiag(diag::RangeWidthOverflow, errorRange);
                    return badExpr(compilation, result);
                }

                selectionRange = *range;
                validateRange(selectionRange);
            }
            else {
                // Otherwise, the resulting range will start with the fixed lower bound of the type.
                int32_t l = selectionKind == RangeSelectionKind::IndexedUp ? valueRange.lower()
                                                                           : valueRange.upper();
                auto range = ConstantRange::getIndexedRange(l, *rv, valueRange.isLittleEndian(),
                                                            selectionKind ==
                                                                RangeSelectionKind::IndexedUp);
                if (!range) {
                    context.addDiag(diag::RangeWidthOverflow, errorRange);
                    return badExpr(compilation, result);
                }

                selectionRange = *range;

                if (bitwidth_t(*rv) > valueRange.width()) {
                    auto& diag = context.addDiag(diag::RangeWidthOOB, right.sourceRange);
                    diag << *rv;
                    diag << valueType;
                }
            }
        }

        // At this point, all expressions are good, ranges have been validated and
        // we know the final width of the selection, so pick the result type and we're done.
        if (valueType.isUnpackedArray()) {
            result->type = compilation.emplace<FixedSizeUnpackedArrayType>(elementType,
                                                                           selectionRange);
        }
        else {
            result->type = compilation.emplace<PackedArrayType>(elementType, selectionRange);
        }
    }
    else {
        // Otherwise, this is a dynamic array so we can't validate much. We should check that
        // the selection endianness is correct for simple ranges -- dynamic arrays only
        // permit big endian [0..N] ordering.
        ConstantRange selectionRange;
        if (selectionKind == RangeSelectionKind::Simple) {
            std::optional<int32_t> lv = context.evalInteger(left);
            if (!lv)
                return badExpr(compilation, result);

            selectionRange = {*lv, *rv};
            if (selectionRange.isLittleEndian() && selectionRange.width() > 1) {
                auto& diag = context.addDiag(diag::SelectEndianDynamic, errorRange);
                diag << selectionRange.left << selectionRange.right;
                diag << valueType;
                return badExpr(compilation, result);
            }
        }
        else {
            if (!context.requireGtZero(rv, right.sourceRange))
                return badExpr(compilation, result);

            selectionRange.left = 0;
            selectionRange.right = *rv - 1;
        }

        result->type = compilation.emplace<FixedSizeUnpackedArrayType>(elementType, selectionRange);
    }

    return *result;
}